

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O3

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_conv_func_by_stl_str_Test<char32_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_conv_func_by_stl_str_Test<char32_t> *this)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  char *in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sv_hash;
  vector<unsigned_long,_std::allocator<unsigned_long>_> s_hash;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> s;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> sv;
  AssertionResult iutest_ar;
  allocator<char> local_2c9;
  AssertionHelper local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_240;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_228;
  string local_208;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_1e8;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  bool local_1b8;
  undefined1 local_1b0 [128];
  ios_base local_130 [264];
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>
            ((u32string *)&local_228,L"arikitari na_world!",L"");
  local_1e8._M_len = local_228._M_string_length;
  local_1e8._M_str = local_228._M_dataplus._M_p;
  local_278 = &local_268;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_278,L"_ ",L"");
  sVar4 = local_270;
  paVar2 = &local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2;
  if (local_278 == &local_268) {
    local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2._8_4_ = local_268._8_4_;
    local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2._12_4_ = local_268._12_4_;
    local_278 = paVar2;
  }
  local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._4_4_ =
       local_268._M_allocated_capacity._4_4_;
  local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       local_268._M_allocated_capacity._0_4_;
  local_2c8.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_270;
  local_270 = 0;
  local_268._M_allocated_capacity._0_4_ = 0;
  pcVar3 = (pointer)(local_1b0 + 0x10);
  pcVar1 = local_278->_M_local_buf + sVar4 * 4;
  local_2c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_278;
  paVar5 = local_278;
  local_278 = &local_268;
  local_1b0._0_8_ = pcVar3;
  std::__cxx11::u32string::_M_construct<char32_t*>((u32string *)local_1b0,paVar5,pcVar1);
  detail::
  operator|<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:441:100),_false,_true,_nullptr>
            (&local_240,&local_228,
             (split_helper_conv_func<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:441:100),_false,_false,_true>
              *)local_1b0);
  if ((pointer)local_1b0._0_8_ != pcVar3) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_2c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity * 4 + 4);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,
                    CONCAT44(local_268._M_allocated_capacity._4_4_,
                             local_268._M_allocated_capacity._0_4_) * 4 + 4);
  }
  local_298 = &local_288;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_298,L"_ ",L"");
  sVar4 = local_290;
  paVar2 = &local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2;
  if (local_298 == &local_288) {
    local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2._8_4_ = local_288._8_4_;
    local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2._12_4_ = local_288._12_4_;
    local_298 = paVar2;
  }
  local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._4_4_ =
       local_288._M_allocated_capacity._4_4_;
  local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       local_288._M_allocated_capacity._0_4_;
  local_2c8.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_290;
  local_290 = 0;
  local_288._M_allocated_capacity._0_4_ = 0;
  pcVar1 = local_298->_M_local_buf + sVar4 * 4;
  local_2c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_298;
  paVar5 = local_298;
  local_298 = &local_288;
  local_1b0._0_8_ = pcVar3;
  std::__cxx11::u32string::_M_construct<char32_t*>((u32string *)local_1b0,paVar5,pcVar1);
  detail::
  operator|<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:444:102),_false,_true,_nullptr>
            (&local_258,&local_1e8,
             (split_helper_conv_func<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:444:102),_false,_false,_true>
              *)local_1b0);
  if ((pointer)local_1b0._0_8_ != pcVar3) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_2c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity * 4 + 4);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,
                    CONCAT44(local_288._M_allocated_capacity._4_4_,
                             local_288._M_allocated_capacity._0_4_) * 4 + 4);
  }
  if ((long)local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_0023cc18;
    iVar6 = bcmp(local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (long)local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_1d8 = &local_1c8;
    local_1d0 = 0;
    local_1c8 = 0;
    local_1b8 = iVar6 == 0;
    if (local_1b8) goto LAB_0023cc18;
  }
  else {
    local_1b8 = false;
  }
  local_1c8 = 0;
  local_1d0 = 0;
  local_1d8 = &local_1c8;
  memset((iu_global_format_stringstream *)local_1b0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
            (&local_208,(internal *)&local_1d8,
             (AssertionResult *)
             "std::equal(s_hash.begin(), s_hash.end(), sv_hash.begin(), sv_hash.end())","false",
             "true",in_R9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,local_208._M_dataplus._M_p,&local_2c9);
  local_2c8.m_part_result.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
  ;
  local_2c8.m_part_result.super_iuCodeMessage.m_line = 0x1c2;
  local_2c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
  iutest::AssertionHelper::OnFixed(&local_2c8,(Fixed *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_2c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
LAB_0023cc18:
  if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_last_by_stl_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(std::basic_string<char_type>(constant::space_underscore<char_type>())) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}